

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O0

ExtPrivkey * __thiscall
cfd::core::DescriptorKeyReference::GetExtPrivkey
          (ExtPrivkey *__return_storage_ptr__,DescriptorKeyReference *this)

{
  undefined8 uVar1;
  ExtPrivkey *pEVar2;
  CfdError error_code;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  ExtPrivkey *in_stack_ffffffffffffffa0;
  allocator local_51;
  string local_50 [32];
  CfdSourceLocation local_30;
  DescriptorKeyReference *local_18;
  DescriptorKeyReference *this_local;
  
  local_18 = this;
  this_local = (DescriptorKeyReference *)__return_storage_ptr__;
  if (this->key_type_ == kDescriptorKeyBip32Priv) {
    ExtPrivkey::ExtPrivkey
              (in_stack_ffffffffffffffa0,
               (ExtPrivkey *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    return __return_storage_ptr__;
  }
  pEVar2 = __return_storage_ptr__;
  local_30.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_descriptor.cpp"
               ,0x2f);
  error_code = (CfdError)((ulong)pEVar2 >> 0x20);
  local_30.filename = local_30.filename + 1;
  local_30.line = 0x19f;
  local_30.funcname = "GetExtPrivkey";
  logger::warn<>(&local_30,"Failed to GetExtPrivkey. unsupported key type.");
  uVar1 = __cxa_allocate_exception(0x30);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_50,"GetExtPrivkey unsupported key type.",&local_51);
  CfdException::CfdException((CfdException *)this,error_code,(string *)__return_storage_ptr__);
  __cxa_throw(uVar1,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

ExtPrivkey DescriptorKeyReference::GetExtPrivkey() const {
  if (key_type_ == DescriptorKeyType::kDescriptorKeyBip32Priv) {
    return extprivkey_;
  }
  warn(CFD_LOG_SOURCE, "Failed to GetExtPrivkey. unsupported key type.");
  throw CfdException(
      CfdError::kCfdIllegalArgumentError,
      "GetExtPrivkey unsupported key type.");
}